

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O1

size_t testing::internal::GetThreadCount(void)

{
  DIR *__dirp;
  dirent *pdVar1;
  size_t sVar2;
  
  __dirp = opendir("/proc/self/task");
  if (__dirp == (DIR *)0x0) {
    sVar2 = 0;
  }
  else {
    sVar2 = 0;
    while (pdVar1 = readdir(__dirp), pdVar1 != (dirent *)0x0) {
      sVar2 = sVar2 + (pdVar1->d_name[0] != '.');
    }
    closedir(__dirp);
  }
  return sVar2;
}

Assistant:

size_t GetThreadCount() {
  size_t thread_count = 0;
  if (DIR *dir = opendir("/proc/self/task")) {
    while (dirent *entry = readdir(dir)) {
      if (entry->d_name[0] != '.')
        ++thread_count;
    }
    closedir(dir);
  }
  return thread_count;
}